

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satpos.cpp
# Opt level: O3

int __thiscall
SatPos::CalculateClkDif(SatPos *this,Ephemeris *Eph,int prn,SATTIME tsv,NavSys sys,double *ClkDif)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Satellite *pSVar4;
  double dVar5;
  double dVar6;
  
  *ClkDif = 0.0;
  pSVar4 = this->Bds;
  if (sys == GPS) {
    pSVar4 = this->Gps;
  }
  dVar1 = *(double *)(&DAT_001114b0 + (ulong)(sys == GPS) * 8);
  dVar2 = Eph[prn].ecc;
  dVar3 = Eph[prn].sqrtA;
  dVar5 = sin(pSVar4[prn].Ek);
  dVar6 = tsv.SOW - Eph[prn].toc;
  *ClkDif = Eph[prn].af2 * dVar6 * dVar6 + Eph[prn].af1 * dVar6 + Eph[prn].af0 +
            dVar5 * dVar1 * dVar2 * dVar3;
  return 0;
}

Assistant:

int SatPos::CalculateClkDif(const Ephemeris* Eph, const int prn, const SATTIME tsv,
                            const NavSys sys, double &ClkDif)
{
    double F, Ek;
    ClkDif = 0;
    try
    {
        if(sys == GPS){
            F = -2 * sqrt(GPSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Gps[prn].Ek;
        }
        else if(sys == BDS){
            F = -2 * sqrt(BDSMIU) / LIGHTSPEED / LIGHTSPEED;
            Ek = Bds[prn].Ek;
        }
    }
    catch(...)
    {
        cout << "error happened when calculation satellite clock difference" << endl;
        return UNKNOWN_ERROR;
    }
    
    double deltatr = F * Eph[prn].ecc * Eph[prn].sqrtA * sin(Ek);
    SATTIME t_now = tsv;
    ClkDif = Eph[prn].af0 + Eph[prn].af1 * (t_now.SOW - Eph[prn].toc) + Eph[prn].af2 * (t_now.SOW - Eph[prn].toc) * (t_now.SOW - Eph[prn].toc)+ deltatr; // 双频观测  不加TGD

    return 0;
}